

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O1

ToolOptions * __thiscall
wasm::ToolOptions::addFeature(ToolOptions *this,Feature feature,string *description)

{
  ToolOptions *pTVar1;
  undefined8 *puVar2;
  long *plVar3;
  string *psVar4;
  long *plVar5;
  Feature f;
  Feature f_00;
  ulong uVar6;
  undefined8 uVar7;
  ToolOptions *local_238;
  ulong uStack_230;
  code *local_228;
  code *pcStack_220;
  ToolOptions *local_218;
  ulong uStack_210;
  code *local_208;
  code *pcStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158;
  long local_150;
  long local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  long *local_138 [2];
  long local_128 [2];
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ToolOptions *local_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"--enable-","");
  FeatureSet::toString_abi_cxx11_(&local_118,(FeatureSet *)(ulong)feature,f);
  uVar6 = 0xf;
  if (local_b8 != local_a8) {
    uVar6 = local_a8[0];
  }
  if (uVar6 < local_118._M_string_length + local_b0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar7 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_118._M_string_length + local_b0) goto LAB_00173153;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00173153:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_118._M_dataplus._M_p);
  }
  local_70 = &local_60;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_60 = *plVar3;
    uStack_58 = *(undefined4 *)(puVar2 + 3);
    uStack_54 = *(undefined4 *)((long)puVar2 + 0x1c);
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*puVar2;
  }
  local_68 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Enable ","");
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_198,(ulong)(description->_M_dataplus)._M_p);
  local_d8 = &local_c8;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c8 = *plVar5;
    uStack_c0 = (undefined4)plVar3[3];
    uStack_bc = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_c8 = *plVar5;
    local_d8 = (long *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Tool options","");
  uStack_230 = (ulong)feature;
  pcStack_220 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:182:12)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:182:12)>
              ::_M_manager;
  local_238 = this;
  psVar4 = (string *)
           ::wasm::Options::add
                     ((string *)this,(string *)&local_70,(string *)local_1b8,(string *)&local_d8,
                      (Arguments)local_178,(function *)0x0,SUB81(&local_238,0));
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"--disable-","");
  FeatureSet::toString_abi_cxx11_(&local_f8,(FeatureSet *)(ulong)feature,f_00);
  uVar6 = 0xf;
  if (local_98 != local_88) {
    uVar6 = local_88[0];
  }
  local_78 = this;
  if (uVar6 < local_f8._M_string_length + local_90) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar7 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_90 <= (ulong)uVar7) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_98);
      goto LAB_00173386;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_f8._M_dataplus._M_p);
LAB_00173386:
  local_50 = &local_40;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_40 = *plVar3;
    uStack_38 = *(undefined4 *)(puVar2 + 3);
    uStack_34 = *(undefined4 *)((long)puVar2 + 0x1c);
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*puVar2;
  }
  local_48 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Disable ","");
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_138,(ulong)(description->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_148 = *plVar5;
    uStack_140 = (undefined4)plVar3[3];
    uStack_13c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar5;
    local_158 = (long *)*plVar3;
  }
  local_150 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Tool options","");
  local_218 = local_78;
  uStack_210 = (ulong)feature;
  pcStack_200 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:192:12)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:192:12)>
              ::_M_manager;
  ::wasm::Options::add
            (psVar4,(string *)&local_50,(string *)local_1f8,(string *)&local_158,
             (Arguments)local_1d8,(function *)0x0,SUB81(&local_218,0));
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  pTVar1 = local_78;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return pTVar1;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, true);
             disabledFeatures.set(feature, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, false);
             disabledFeatures.set(feature, true);
           });
    return *this;
  }